

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS
ref_cavity_find_seg(REF_CAVITY ref_cavity,REF_INT *nodes,REF_INT *found_seg,REF_BOOL *reversed)

{
  int iVar1;
  REF_BOOL RVar2;
  long lVar3;
  int *piVar4;
  
  *found_seg = -1;
  if (0 < (long)ref_cavity->maxseg) {
    piVar4 = ref_cavity->s2n + 1;
    lVar3 = 0;
    do {
      iVar1 = piVar4[-1];
      if (iVar1 != -1) {
        if ((*nodes == iVar1) && (nodes[1] == *piVar4)) {
          RVar2 = 0;
LAB_0015d6bd:
          *found_seg = (REF_INT)lVar3;
          *reversed = RVar2;
          return 0;
        }
        if ((nodes[1] == iVar1) && (*nodes == *piVar4)) {
          RVar2 = 1;
          goto LAB_0015d6bd;
        }
      }
      lVar3 = lVar3 + 1;
      piVar4 = piVar4 + 3;
    } while (ref_cavity->maxseg != lVar3);
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_find_seg(REF_CAVITY ref_cavity, REF_INT *nodes,
                                       REF_INT *found_seg, REF_BOOL *reversed) {
  REF_INT seg;

  *found_seg = REF_EMPTY;

  each_ref_cavity_valid_seg(ref_cavity, seg) {
    if ((nodes[0] == ref_cavity_s2n(ref_cavity, 0, seg) &&
         nodes[1] == ref_cavity_s2n(ref_cavity, 1, seg))) {
      *found_seg = seg;
      *reversed = REF_FALSE;
      return REF_SUCCESS;
    }
    if ((nodes[1] == ref_cavity_s2n(ref_cavity, 0, seg) &&
         nodes[0] == ref_cavity_s2n(ref_cavity, 1, seg))) {
      *found_seg = seg;
      *reversed = REF_TRUE;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}